

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkAllocVec(ARKodeMem ark_mem,N_Vector tmpl,N_Vector *v)

{
  long lVar1;
  long *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  
  if (*in_RDX == 0) {
    lVar1 = N_VClone(in_RSI);
    *in_RDX = lVar1;
    if (*in_RDX == 0) {
      arkFreeVectors((ARKodeMem)0x17a2b8);
      return 0;
    }
    *(long *)(in_RDI + 0x348) = *(long *)(in_RDI + 0x338) + *(long *)(in_RDI + 0x348);
    *(long *)(in_RDI + 0x350) = *(long *)(in_RDI + 0x340) + *(long *)(in_RDI + 0x350);
  }
  return 1;
}

Assistant:

sunbooleantype arkAllocVec(ARKodeMem ark_mem, N_Vector tmpl, N_Vector* v)
{
  /* allocate the new vector if necessary */
  if (*v == NULL)
  {
    *v = N_VClone(tmpl);
    if (*v == NULL)
    {
      arkFreeVectors(ark_mem);
      return (SUNFALSE);
    }
    else
    {
      ark_mem->lrw += ark_mem->lrw1;
      ark_mem->liw += ark_mem->liw1;
    }
  }
  return (SUNTRUE);
}